

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

IOHANDLE __thiscall
CStorage::OpenFile(CStorage *this,char *pFilename,int Flags,int Type,char *pBuffer,int BufferSize,
                  FCheckCallback pfnCheckCB,void *pCheckCBData)

{
  int iVar1;
  ulong uVar2;
  int in_ECX;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  undefined1 *in_R8;
  long in_FS_OFFSET;
  code *in_stack_00000008;
  undefined8 in_stack_00000010;
  int i;
  int UB;
  int LB;
  IOHANDLE Handle;
  char aBuffer [512];
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  char *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  int local_248;
  int local_244;
  undefined1 *local_230;
  IOHANDLE local_210;
  undefined1 local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_230 = in_R8;
  if (in_R8 == (undefined1 *)0x0) {
    local_230 = local_208;
  }
  iVar1 = str_path_unsafe(in_RSI);
  if (iVar1 == 0) {
    if ((in_EDX & 2) == 0) {
      local_244 = 0;
      local_248 = *(int *)(in_RDI + 0x2010);
      if ((in_ECX < 0) || (*(int *)(in_RDI + 0x2010) <= in_ECX)) {
        dbg_assert_imp(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98
                       ,(char *)0x15ea42);
        in_ECX = local_244;
      }
      else {
        local_248 = in_ECX + 1;
      }
      for (; in_ECX < local_248; in_ECX = in_ECX + 1) {
        GetPath((CStorage *)CONCAT44(in_ECX,in_stack_fffffffffffffdb0),(int)((ulong)in_RDI >> 0x20),
                in_stack_fffffffffffffda0,
                (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),0);
        local_210 = io_open(in_RDI,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
        if (local_210 != (IOHANDLE)0x0) {
          if ((in_stack_00000008 == (code *)0x0) ||
             (uVar2 = (*in_stack_00000008)(local_210,in_stack_00000010), (uVar2 & 1) != 0))
          goto LAB_0015eafc;
          io_close((IOHANDLE)0x15eabe);
        }
      }
      *local_230 = 0;
      local_210 = (IOHANDLE)0x0;
    }
    else {
      GetPath((CStorage *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
              (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffda0,
              (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),0);
      local_210 = io_open(in_RDI,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
    }
  }
  else {
    dbg_msg("storage",
            "refusing to open path which looks like it could escape those specified in \'storage.cfg\': %s"
            ,in_RSI);
    local_210 = (IOHANDLE)0x0;
  }
LAB_0015eafc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_210;
}

Assistant:

virtual IOHANDLE OpenFile(const char *pFilename, int Flags, int Type, char *pBuffer = 0, int BufferSize = 0, FCheckCallback pfnCheckCB = 0, const void *pCheckCBData = 0)
	{
		char aBuffer[IO_MAX_PATH_LENGTH];
		if(!pBuffer)
		{
			pBuffer = aBuffer;
			BufferSize = sizeof(aBuffer);
		}

		// Check whether the path contains '..' (parent directory) paths. We'd
		// normally still have to check whether it is an absolute path
		// (starts with a path separator (or a drive name on windows)),
		// but since we concatenate this path with another path later
		// on, this can't become absolute.
		//
		// E. g. "/etc/passwd" => "/path/to/storage//etc/passwd", which
		// is safe.
		if(str_path_unsafe(pFilename) != 0)
		{
			dbg_msg("storage", "refusing to open path which looks like it could escape those specified in 'storage.cfg': %s", pFilename);
			return 0;
		}

		// open file
		if(Flags&IOFLAG_WRITE)
		{
			return io_open(GetPath(TYPE_SAVE, pFilename, pBuffer, BufferSize), Flags);
		}
		else
		{
			IOHANDLE Handle = 0;
			int LB = 0, UB = m_NumPaths;	// check all available directories

			if(Type >= 0 && Type < m_NumPaths)	// check wanted directory
			{
				LB = Type;
				UB = Type + 1;
			}
			else
				dbg_assert(Type == TYPE_ALL, "invalid storage type");

			for(int i = LB; i < UB; ++i)
			{
				Handle = io_open(GetPath(i, pFilename, pBuffer, BufferSize), Flags);
				if(Handle)
				{
					// do an additional check on the file
					if(pfnCheckCB && !pfnCheckCB(Handle, pCheckCBData))
					{
						io_close(Handle);
						Handle = 0;
					}
					else
						return Handle;
				}
			}
		}

		pBuffer[0] = 0;
		return 0;
	}